

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O0

uint64_t msr_set_zone_clamped
                   (raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,int *cl_long,
                   int *cl_short)

{
  uint8_t local_32;
  uint8_t local_31;
  uint8_t cl2_bit;
  int *piStack_30;
  uint8_t cl1_bit;
  int *cl_short_local;
  int *cl_long_local;
  uint64_t msrval_local;
  raplcap_msr_ctx *prStack_10;
  raplcap_zone zone_local;
  raplcap_msr_ctx *ctx_local;
  
  piStack_30 = cl_short;
  cl_short_local = cl_long;
  cl_long_local = (int *)msrval;
  msrval_local._4_4_ = zone;
  prStack_10 = ctx;
  if (ctx != (raplcap_msr_ctx *)0x0) {
    local_31 = '\x10';
    local_32 = '0';
    zone_clamped_quirks(ctx,zone,&local_31,&local_32);
    if (cl_short_local != (int *)0x0) {
      cl_long_local =
           (int *)replace_bits((uint64_t)cl_long_local,(long)(int)(uint)(*cl_short_local != 0),
                               local_31,local_31);
    }
    if ((piStack_30 != (int *)0x0) && (1 < prStack_10->cfg[msrval_local._4_4_].constraints)) {
      cl_long_local =
           (int *)replace_bits((uint64_t)cl_long_local,(long)(int)(uint)(*piStack_30 != 0),local_32,
                               local_32);
    }
    return (uint64_t)cl_long_local;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x24c,
                "uint64_t msr_set_zone_clamped(const raplcap_msr_ctx *, raplcap_zone, uint64_t, const int *, const int *)"
               );
}

Assistant:

uint64_t msr_set_zone_clamped(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                              const int* cl_long, const int* cl_short) {
  assert(ctx != NULL);
  uint8_t cl1_bit = 16;
  uint8_t cl2_bit = 48;
  zone_clamped_quirks(ctx, zone, &cl1_bit, &cl2_bit);
  if (cl_long != NULL) {
    raplcap_log(DEBUG, "msr_set_zone_clamped: zone=%d, long_term: clamp=%d\n", zone, *cl_long);
    msrval = replace_bits(msrval, *cl_long ? 0x1 : 0x0, cl1_bit, cl1_bit);
  }
  if (cl_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    raplcap_log(DEBUG, "msr_set_zone_clamped: zone=%d, short_term: clamp=%d\n", zone, *cl_short);
    msrval = replace_bits(msrval, *cl_short ? 0x1 : 0x0, cl2_bit, cl2_bit);
  }
  return msrval;
}